

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ClipControlApi::ClipControlApi(ClipControlApi *this,Context *context,API api)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  this->m_context = context;
  bVar1 = Supported(context,api);
  if (bVar1) {
    if (api < 2) {
      iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
      this->clipControl = *(glClipControlFunc *)(CONCAT44(extraout_var,iVar2) + 0x230);
    }
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Required clip_control extension is not supported",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ClipControlApi(deqp::Context& context, ClipControlTests::API api) : m_context(context)
	{
		if (!Supported(m_context, api))
		{
			throw tcu::NotSupportedError("Required clip_control extension is not supported");
		}

		switch (api)
		{
		case ClipControlTests::API_GL_ARB_clip_control:
		case ClipControlTests::API_GL_45core: //fall through
			clipControl = context.getRenderContext().getFunctions().clipControl;
			break;
		}
	}